

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_vector.hpp
# Opt level: O3

void __thiscall
tlx::SimpleVector<foxxll::BID<0UL>,_(tlx::SimpleVectorMode)0>::resize
          (SimpleVector<foxxll::BID<0UL>,_(tlx::SimpleVectorMode)0> *this,size_type new_size)

{
  value_type *__src;
  undefined1 auVar1 [16];
  ulong uVar2;
  value_type *__s;
  ulong uVar3;
  value_type *tmp;
  
  __src = this->array_;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = new_size;
  uVar2 = SUB168(auVar1 * ZEXT816(0x18),0);
  uVar3 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0x18),8) == 0) {
    uVar3 = uVar2;
  }
  __s = (value_type *)operator_new__(uVar3);
  if (__src == (value_type *)0x0) {
    if (new_size != 0) {
      memset(__s,0,((uVar2 - 0x18) / 0x18) * 0x18 + 0x18);
    }
    this->array_ = __s;
  }
  else {
    if (new_size != 0) {
      memset(__s,0,((uVar2 - 0x18) / 0x18) * 0x18 + 0x18);
    }
    this->array_ = __s;
    uVar3 = this->size_;
    if (new_size <= this->size_) {
      uVar3 = new_size;
    }
    if (uVar3 != 0) {
      memmove(__s,__src,uVar3 * 0x18);
    }
    operator_delete__(__src);
  }
  this->size_ = new_size;
  return;
}

Assistant:

void resize(size_type new_size) {
        if (array_) {
            value_type* tmp = array_;
            array_ = create_array(new_size);
            std::move(tmp, tmp + std::min(size_, new_size), array_);
            destroy_array(tmp, size_);
            size_ = new_size;
        }
        else {
            array_ = create_array(new_size);
            size_ = new_size;
        }
    }